

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hh
# Opt level: O2

void __thiscall
TokenSplit::tagVariable(TokenSplit *this,char *ptr,syntax_highlight h,Varnode *v,PcodeOp *o)

{
  std::__cxx11::string::assign((char *)&this->tok);
  this->size = (int4)(this->tok)._M_string_length;
  this->tagtype = vari_t;
  this->delimtype = tokenstring;
  this->hl = h;
  (this->ptr_second).vn = v;
  this->op = o;
  return;
}

Assistant:

void tagVariable(const char *ptr,EmitXml::syntax_highlight h,
		    const Varnode *v,const PcodeOp *o) {
    tok = ptr; size = tok.size();
    tagtype=vari_t; delimtype=tokenstring; hl=h; ptr_second.vn=v; op=o; }